

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slider.cpp
# Opt level: O0

QRect __thiscall QtMWidgets::SliderPrivate::grooveRect(SliderPrivate *this)

{
  int iVar1;
  int iVar2;
  undefined1 auVar3 [16];
  QPoint local_60;
  QPoint local_58;
  QPoint local_50;
  QPoint local_48;
  int local_40;
  int local_3c;
  int gh;
  int gw;
  int gy;
  int gx;
  QRect cr;
  SliderPrivate *this_local;
  
  cr._8_8_ = this;
  auVar3 = QWidget::contentsRect();
  cr._0_8_ = auVar3._8_8_;
  _gy = auVar3._0_8_;
  gw = 0;
  gh = 0;
  local_3c = 0;
  local_40 = 0;
  iVar1 = QAbstractSlider::orientation();
  if (iVar1 == 2) {
    local_48 = QRect::topLeft((QRect *)&gy);
    iVar1 = QPoint::x(&local_48);
    iVar2 = QRect::width((QRect *)&gy);
    gw = iVar1 + (iVar2 - this->grooveHeight) / 2;
    local_50 = QRect::topLeft((QRect *)&gy);
    iVar1 = QPoint::y(&local_50);
    gh = iVar1 + 1;
    local_3c = this->grooveHeight;
    local_40 = QRect::height((QRect *)&gy);
    local_40 = local_40 + -2;
  }
  else {
    local_58 = QRect::topLeft((QRect *)&gy);
    iVar1 = QPoint::x(&local_58);
    gw = iVar1 + 1;
    local_60 = QRect::topLeft((QRect *)&gy);
    iVar1 = QPoint::y(&local_60);
    iVar2 = QRect::height((QRect *)&gy);
    gh = iVar1 + (iVar2 - this->grooveHeight) / 2;
    local_3c = QRect::width((QRect *)&gy);
    local_3c = local_3c + -2;
    local_40 = this->grooveHeight;
  }
  QRect::QRect((QRect *)&this_local,gw,gh,local_3c,local_40);
  return _this_local;
}

Assistant:

QRect
SliderPrivate::grooveRect() const
{
	const QRect cr = q->contentsRect();

	int gx = 0, gy = 0, gw = 0, gh = 0;

	if( q->orientation() == Qt::Vertical )
	{
		gx = cr.topLeft().x() + ( cr.width() - grooveHeight ) / 2;
		gy = cr.topLeft().y() + 1;
		gw = grooveHeight;
		gh = cr.height() - 2;
	}
	else
	{
		gx = cr.topLeft().x() + 1;
		gy = cr.topLeft().y() + ( cr.height() - grooveHeight ) / 2;
		gw = cr.width() - 2;
		gh = grooveHeight;
	}

	return QRect( gx, gy, gw, gh );
}